

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_TemplateString::Test_Template_TemplateString(Test_Template_TemplateString *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, TemplateString) {
  // Make sure using TemplateString and StaticTemplateString for the
  // dictionary expands the same as using char*'s.
  Template* tpl = StringToTemplate("hi {{VAR}} lo", STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  dict.SetValue("VAR", TemplateString("short-lived", strlen("short")));
  AssertExpandIs(tpl, &dict, "hi short lo", true);
  dict.SetValue("VAR", kHello);
  AssertExpandIs(tpl, &dict, "hi Hello lo", true);
}